

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xxhash.h
# Opt level: O0

XXH128_hash_t
XXH3_hashLong_128b_default(void *input,size_t len,XXH64_hash_t seed64,void *secret,size_t secretLen)

{
  XXH128_hash_t XVar1;
  size_t in_stack_00000028;
  xxh_u8 *in_stack_00000030;
  size_t in_stack_00000038;
  void *in_stack_00000040;
  
  XVar1 = XXH3_hashLong_128b_internal
                    (in_stack_00000040,in_stack_00000038,in_stack_00000030,in_stack_00000028,
                     (XXH3_f_accumulate_512)input,(XXH3_f_scrambleAcc)len);
  return XVar1;
}

Assistant:

XXH_NO_INLINE XXH128_hash_t XXH3_hashLong_128b_default(
    const void* XXH_RESTRICT input, size_t len, XXH64_hash_t seed64,
    const void* XXH_RESTRICT secret, size_t secretLen) {
  (void)seed64;
  (void)secret;
  (void)secretLen;
  return XXH3_hashLong_128b_internal(input, len, XXH3_kSecret,
                                     sizeof(XXH3_kSecret), XXH3_accumulate_512,
                                     XXH3_scrambleAcc);
}